

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spxsolver.hpp
# Opt level: O1

bool __thiscall
soplex::
SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
::isTimeLimitReached
          (SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
           *this,bool forceCheck)

{
  int iVar1;
  double *pdVar2;
  double extraout_XMM0_Qa;
  cpp_dec_float<50U,_int,_void> local_98;
  cpp_dec_float<50U,_int,_void> local_58;
  
  this->nCallsToTimelim = this->nCallsToTimelim + 1;
  ::soplex::infinity::__tls_init();
  pdVar2 = (double *)__tls_get_addr(&PTR_003b6b60);
  local_98.fpclass = cpp_dec_float_finite;
  local_98.prec_elem = 10;
  local_98.data._M_elems[0] = 0;
  local_98.data._M_elems[1] = 0;
  local_98.data._M_elems[2] = 0;
  local_98.data._M_elems[3] = 0;
  local_98.data._M_elems[4] = 0;
  local_98.data._M_elems[5] = 0;
  local_98.data._M_elems._24_5_ = 0;
  local_98.data._M_elems[7]._1_3_ = 0;
  local_98.data._M_elems._32_5_ = 0;
  local_98._37_8_ = 0;
  boost::multiprecision::backends::cpp_dec_float<50u,int,void>::operator=
            ((cpp_dec_float<50u,int,void> *)&local_98,*pdVar2);
  if ((!NAN(this->maxTime)) && (local_98.fpclass != cpp_dec_float_NaN)) {
    local_58.fpclass = cpp_dec_float_finite;
    local_58.prec_elem = 10;
    local_58.data._M_elems[0] = 0;
    local_58.data._M_elems[1] = 0;
    local_58.data._M_elems[2] = 0;
    local_58.data._M_elems[3] = 0;
    local_58.data._M_elems[4] = 0;
    local_58.data._M_elems[5] = 0;
    local_58.data._M_elems._24_5_ = 0;
    local_58.data._M_elems[7]._1_3_ = 0;
    local_58.data._M_elems._32_5_ = 0;
    local_58._37_8_ = 0;
    boost::multiprecision::backends::cpp_dec_float<50u,int,void>::operator=
              ((cpp_dec_float<50u,int,void> *)&local_58,this->maxTime);
    iVar1 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::compare
                      (&local_98,&local_58);
    if (iVar1 < 1) {
      return false;
    }
  }
  if (((forceCheck) || (this->nCallsToTimelim < 200)) || (this->nClckSkipsLeft < 1)) {
    (*this->theTime->_vptr_Timer[6])();
    if (this->maxTime <= extraout_XMM0_Qa) {
      return true;
    }
    iVar1 = (uint)(32.0 <= ((this->maxTime - extraout_XMM0_Qa) * 0.01) /
                           ((this->theCumulativeTime + extraout_XMM0_Qa) /
                            (double)this->nCallsToTimelim + 1e-06)) << 5;
  }
  else {
    iVar1 = this->nClckSkipsLeft + -1;
  }
  this->nClckSkipsLeft = iVar1;
  return false;
}

Assistant:

bool SPxSolverBase<R>::isTimeLimitReached(const bool forceCheck)
   {
      // always update the number of calls, since the user might set a time limit later in the solving process
      ++nCallsToTimelim;

      // check if a time limit is actually set
      if(maxTime >= R(infinity))
         return false;

      // check if the expensive system call to update the time should be skipped again
      if(forceCheck || nCallsToTimelim < SOPLEX_NINITCALLS ||  nClckSkipsLeft <= 0)
      {
         Real currtime = time();

         if(currtime >= maxTime)
            return true;

         // determine the number of times the clock can be skipped again.
         int nClckSkips = SOPLEX_MAXNCLCKSKIPS;
         Real avgtimeinterval = (currtime + cumulativeTime()) / (Real)(nCallsToTimelim);

         // it would not be safe to skip the clock so many times since we are approaching the time limit
         if(SOPLEX_SAFETYFACTOR * (maxTime - currtime) / (avgtimeinterval + 1e-6) < nClckSkips)
            nClckSkips = 0;

         nClckSkipsLeft = nClckSkips;
      }
      else
         --nClckSkipsLeft;

      return false;
   }